

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::BlobProto::ByteSizeLong(BlobProto *this)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  uVar4 = 0;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar8 = 0;
  }
  else {
    sVar8 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar6 = (ulong)(uint)(this->data_).current_size_;
  lVar9 = uVar6 * 4;
  if (uVar6 != 0) {
    uVar4 = (uint)lVar9;
    if ((int)uVar4 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    sVar8 = sVar8 + uVar6;
  }
  this->_data_cached_byte_size_ = uVar4;
  lVar9 = sVar8 + lVar9;
  uVar6 = (ulong)(uint)(this->diff_).current_size_;
  lVar1 = uVar6 * 4;
  uVar4 = 0;
  if (uVar6 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (uint)lVar1;
    if ((int)uVar7 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar7 | 1) != 0) {
        for (; (uVar7 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    lVar9 = lVar9 + uVar6;
  }
  this->_diff_cached_byte_size_ = uVar7;
  lVar9 = lVar9 + lVar1;
  uVar6 = (ulong)(uint)(this->double_data_).current_size_;
  lVar1 = uVar6 * 8;
  if (uVar6 != 0) {
    uVar4 = (uint)lVar1;
    if ((int)uVar4 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    lVar9 = lVar9 + uVar6;
  }
  this->_double_data_cached_byte_size_ = uVar4;
  lVar9 = lVar9 + lVar1;
  uVar6 = (ulong)(uint)(this->double_diff_).current_size_;
  lVar1 = uVar6 * 8;
  if (uVar6 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (uint)lVar1;
    if ((int)uVar4 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    lVar9 = lVar9 + uVar6;
  }
  this->_double_diff_cached_byte_size_ = uVar4;
  sVar8 = lVar9 + lVar1;
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 0x1f) != 0) {
    if ((uVar4 & 1) != 0) {
      sVar5 = BlobShape::ByteSizeLong(this->shape_);
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
      uVar4 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar4 & 2) != 0) {
      if (this->num_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar7 = this->num_ | 1;
        iVar3 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
    if ((uVar4 & 4) != 0) {
      if (this->channels_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar7 = this->channels_ | 1;
        iVar3 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
    if ((uVar4 & 8) != 0) {
      if (this->height_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar7 = this->height_ | 1;
        iVar3 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
    if ((uVar4 & 0x10) != 0) {
      if (this->width_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar4 = this->width_ | 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
  }
  this->_cached_size_ = (int)sVar8;
  return sVar8;
}

Assistant:

size_t BlobProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.BlobProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float data = 5 [packed = true];
  {
    unsigned int count = this->data_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _data_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated float diff = 6 [packed = true];
  {
    unsigned int count = this->diff_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _diff_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double double_data = 8 [packed = true];
  {
    unsigned int count = this->double_data_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _double_data_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double double_diff = 9 [packed = true];
  {
    unsigned int count = this->double_diff_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _double_diff_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 31u) {
    // optional .caffe.BlobShape shape = 7;
    if (has_shape()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->shape_);
    }

    // optional int32 num = 1 [default = 0];
    if (has_num()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->num());
    }

    // optional int32 channels = 2 [default = 0];
    if (has_channels()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->channels());
    }

    // optional int32 height = 3 [default = 0];
    if (has_height()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->height());
    }

    // optional int32 width = 4 [default = 0];
    if (has_width()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->width());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}